

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_to(basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
       basic_json_visitor<char> *visitor)

{
  ser_error *this_00;
  undefined8 extraout_RAX;
  error_code ec_00;
  error_code ec;
  uint local_28 [2];
  error_category *local_20;
  
  local_28[0] = 0;
  local_20 = (error_category *)std::_V2::system_category();
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[6])(this,visitor,local_28);
  if (local_28[0] == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_28[0];
  ec_00._M_cat = local_20;
  ser_error::ser_error(this_00,ec_00,0,(this->parser_).source_.position_);
  basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_to
            ((basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void read_to(basic_json_visitor<char_type>& visitor) override
    {
        std::error_code ec;
        read_to(visitor, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
        }
    }